

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

RPCHelpMan * wallet::walletprocesspsbt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  undefined1 auVar3 [32];
  long *plVar4;
  RPCHelpMan *in_RDI;
  long lVar5;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_ffffffffffffefe8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffefec;
  undefined8 in_stack_ffffffffffffeff8;
  undefined8 in_stack_fffffffffffff000;
  undefined8 in_stack_fffffffffffff008;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff010;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff018;
  pointer in_stack_fffffffffffff028;
  pointer pRVar8;
  pointer in_stack_fffffffffffff030;
  pointer pRVar9;
  pointer in_stack_fffffffffffff038;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff040;
  pointer in_stack_fffffffffffff048;
  pointer pRVar11;
  pointer in_stack_fffffffffffff050;
  pointer pRVar12;
  pointer in_stack_fffffffffffff058;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff060;
  pointer in_stack_fffffffffffff068;
  pointer pRVar14;
  pointer in_stack_fffffffffffff070;
  pointer pRVar15;
  pointer in_stack_fffffffffffff078;
  undefined8 in_stack_fffffffffffff080;
  undefined1 in_stack_fffffffffffff088 [53];
  bool in_stack_fffffffffffff0bd;
  bool bVar16;
  bool in_stack_fffffffffffff0be;
  bool bVar17;
  bool in_stack_fffffffffffff0bf;
  bool bVar18;
  undefined1 in_stack_fffffffffffff0c0 [16];
  string local_f28;
  string local_f08;
  string local_ee8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ec8;
  size_type local_ec0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_eb8;
  long *local_ea8 [2];
  long local_e98 [2];
  long *local_e88 [2];
  long local_e78 [2];
  long *local_e68 [2];
  long local_e58 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_e48;
  long *local_e28 [2];
  long local_e18 [2];
  pointer local_e08 [2];
  undefined1 local_df8 [152];
  RPCResult local_d60;
  RPCResult local_cd8;
  long *local_c50 [2];
  long local_c40 [2];
  long *local_c30 [2];
  long local_c20 [2];
  RPCResult local_c10;
  undefined1 local_b88;
  undefined1 *local_b80;
  undefined8 local_b78;
  undefined1 local_b70;
  undefined7 uStack_b6f;
  undefined1 local_b60 [32];
  long *local_b40 [2];
  long local_b30 [2];
  UniValue local_b20;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ac8;
  undefined1 local_a70;
  long *local_a68 [2];
  long local_a58 [2];
  undefined1 local_a48;
  undefined1 *local_a40;
  undefined8 local_a38;
  undefined1 local_a30;
  undefined7 uStack_a2f;
  undefined1 local_a20 [32];
  long *local_a00 [2];
  long local_9f0 [2];
  UniValue local_9e0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_988;
  undefined1 local_930;
  long *local_928 [2];
  long local_918 [2];
  undefined1 local_908;
  undefined1 *local_900;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined7 uStack_8ef;
  undefined1 local_8e0 [32];
  long *local_8c0 [2];
  long local_8b0 [2];
  UniValue local_8a0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_848;
  undefined1 local_7f0;
  long *local_7e8 [2];
  long local_7d8 [2];
  undefined1 local_7c8;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  undefined1 local_7b0;
  undefined7 uStack_7af;
  undefined1 local_7a0 [32];
  long *local_780 [2];
  long local_770 [2];
  UniValue local_760;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_708;
  undefined1 local_6b0;
  long *local_6a8 [2];
  long local_698 [2];
  undefined1 local_688;
  vector<RPCArg,_std::allocator<RPCArg>_> local_680;
  undefined1 auStack_668 [8];
  undefined1 local_660 [32];
  long *local_640 [2];
  long local_630 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_620;
  undefined1 local_5c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c0;
  RPCArg local_5a0;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"walletprocesspsbt","");
  std::operator+(&local_78,
                 "\nUpdate a PSBT with input information from our wallet and then sign inputs\nthat we can sign for."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &HELP_REQUIRING_PASSPHRASE_abi_cxx11_);
  local_5c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_5c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"psbt","");
  local_620._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_5c8 = 0;
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,"The transaction base64 string","");
  local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_688 = 0;
  local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_660._0_8_ = (pointer)0x0;
  local_660._8_2_ = 0;
  local_660._10_6_ = 0;
  local_660._16_2_ = 0;
  local_660._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  name.field_2._8_8_ = in_stack_fffffffffffff000;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff010;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff008;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff018;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff028;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff030;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff038;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff040;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff048;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff050;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff058;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff060;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff070;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff078;
  description_04.field_2._8_8_ = in_stack_fffffffffffff080;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = in_stack_fffffffffffff0bd;
  opts._0_53_ = in_stack_fffffffffffff088;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = in_stack_fffffffffffff0be;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff0bf;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0c0._0_8_;
  opts.hidden = (bool)in_stack_fffffffffffff0c0[8];
  opts.also_positional = (bool)in_stack_fffffffffffff0c0[9];
  opts._66_6_ = in_stack_fffffffffffff0c0._10_6_;
  ::RPCArg::RPCArg(&local_5a0,name,(Type)&local_5c0,fallback,description_04,opts);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"sign","");
  bVar18 = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_760,(bool *)&stack0xfffffffffffff0bf);
  paVar1 = &local_760.val.field_2;
  local_708._8_8_ = (long)&local_708 + 0x18;
  local_708._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_760.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.val._M_dataplus._M_p == paVar1) {
    local_708._32_8_ = local_760.val.field_2._8_8_;
  }
  else {
    local_708._8_8_ = local_760.val._M_dataplus._M_p;
  }
  local_708._16_8_ = local_760.val._M_string_length;
  local_760.val._M_string_length = 0;
  local_760.val.field_2._M_local_buf[0] = '\0';
  local_708._40_8_ =
       local_760.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_708._48_8_ =
       local_760.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_708._56_8_ =
       local_760.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_760.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_760.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_760.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_708._64_4_ =
       local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_708._68_4_ =
       local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_708._72_4_ =
       local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_708._76_4_ =
       local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_708._80_8_ =
       local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_760.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b0 = 2;
  local_780[0] = local_770;
  local_760.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_780,
             "Also sign the transaction when updating (requires wallet to be unlocked)","");
  local_7c0 = &local_7b0;
  local_7c8 = 0;
  local_7b8 = 0;
  local_7b0 = 0;
  local_7a0._0_8_ = (pointer)0x0;
  local_7a0._8_2_ = 0;
  local_7a0._10_6_ = 0;
  local_7a0._16_2_ = 0;
  local_7a0._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff000;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff010;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff008;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff018;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff028;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff030;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff038;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff040;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff048;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff050;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff058;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff060;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff070;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff078;
  description_05.field_2._8_8_ = in_stack_fffffffffffff080;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = in_stack_fffffffffffff0bd;
  opts_00._0_53_ = in_stack_fffffffffffff088;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = in_stack_fffffffffffff0be;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = bVar18;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0c0._0_8_;
  opts_00.hidden = (bool)in_stack_fffffffffffff0c0[8];
  opts_00.also_positional = (bool)in_stack_fffffffffffff0c0[9];
  opts_00._66_6_ = in_stack_fffffffffffff0c0._10_6_;
  ::RPCArg::RPCArg(&local_498,name_00,(Type)local_6a8,fallback_00,description_05,opts_00);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"sighashtype","");
  ::UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (&local_8a0,(char (*) [35])"DEFAULT for Taproot, ALL otherwise");
  paVar1 = &local_8a0.val.field_2;
  local_848._8_8_ = (long)&local_848 + 0x18;
  local_848._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_8a0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.val._M_dataplus._M_p == paVar1) {
    local_848._32_8_ = local_8a0.val.field_2._8_8_;
  }
  else {
    local_848._8_8_ = local_8a0.val._M_dataplus._M_p;
  }
  local_848._16_8_ = local_8a0.val._M_string_length;
  local_8a0.val._M_string_length = 0;
  local_8a0.val.field_2._M_local_buf[0] = '\0';
  local_848._40_8_ =
       local_8a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_848._48_8_ =
       local_8a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_848._56_8_ =
       local_8a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_8a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_848._64_4_ =
       local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_848._68_4_ =
       local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_848._72_4_ =
       local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_848._76_4_ =
       local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_848._80_8_ =
       local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7f0 = 2;
  local_8c0[0] = local_8b0;
  local_8a0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,
             "The signature hash type to sign with if not specified by the PSBT. Must be one of\n       \"DEFAULT\"\n       \"ALL\"\n       \"NONE\"\n       \"SINGLE\"\n       \"ALL|ANYONECANPAY\"\n       \"NONE|ANYONECANPAY\"\n       \"SINGLE|ANYONECANPAY\""
             ,"");
  local_900 = &local_8f0;
  local_908 = 0;
  local_8f8 = 0;
  local_8f0 = 0;
  local_8e0._0_8_ = (pointer)0x0;
  local_8e0._8_2_ = 0;
  local_8e0._10_6_ = 0;
  local_8e0._16_2_ = 0;
  local_8e0._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  name_01._M_string_length = (size_type)in_RDI;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  name_01.field_2._8_8_ = in_stack_fffffffffffff000;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff010;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff008;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff018;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff028;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff030;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff038;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff040;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff048;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff050;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff058;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff060;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff070;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff078;
  description_06.field_2._8_8_ = in_stack_fffffffffffff080;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = in_stack_fffffffffffff0bd;
  opts_01._0_53_ = in_stack_fffffffffffff088;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = in_stack_fffffffffffff0be;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = bVar18;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0c0._0_8_;
  opts_01.hidden = (bool)in_stack_fffffffffffff0c0[8];
  opts_01.also_positional = (bool)in_stack_fffffffffffff0c0[9];
  opts_01._66_6_ = in_stack_fffffffffffff0c0._10_6_;
  ::RPCArg::RPCArg(&local_390,name_01,(Type)local_7e8,fallback_01,description_06,opts_01);
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"bip32derivs","");
  bVar17 = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_9e0,(bool *)&stack0xfffffffffffff0be);
  paVar1 = &local_9e0.val.field_2;
  local_988._8_8_ = (long)&local_988 + 0x18;
  local_988._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_9e0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0.val._M_dataplus._M_p == paVar1) {
    local_988._32_8_ = local_9e0.val.field_2._8_8_;
  }
  else {
    local_988._8_8_ = local_9e0.val._M_dataplus._M_p;
  }
  local_988._16_8_ = local_9e0.val._M_string_length;
  local_9e0.val._M_string_length = 0;
  local_9e0.val.field_2._M_local_buf[0] = '\0';
  local_988._40_8_ =
       local_9e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_988._48_8_ =
       local_9e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_988._56_8_ =
       local_9e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_9e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_988._64_4_ =
       local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_988._68_4_ =
       local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_988._72_4_ =
       local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_988._76_4_ =
       local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_988._80_8_ =
       local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_930 = 2;
  local_a00[0] = local_9f0;
  local_9e0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a00,"Include BIP 32 derivation paths for public keys if we know them",
             "");
  local_a40 = &local_a30;
  local_a48 = 0;
  local_a38 = 0;
  local_a30 = 0;
  local_a20._0_8_ = (pointer)0x0;
  local_a20._8_2_ = 0;
  local_a20._10_6_ = 0;
  local_a20._16_2_ = 0;
  local_a20._18_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  name_02._M_string_length = (size_type)in_RDI;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  name_02.field_2._8_8_ = in_stack_fffffffffffff000;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff010;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff008;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff018;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff028;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff030;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff038;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff040;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff048;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff050;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff058;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff060;
  description_07._M_string_length = (size_type)in_stack_fffffffffffff070;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff078;
  description_07.field_2._8_8_ = in_stack_fffffffffffff080;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = in_stack_fffffffffffff0bd;
  opts_02._0_53_ = in_stack_fffffffffffff088;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = bVar17;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = bVar18;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0c0._0_8_;
  opts_02.hidden = (bool)in_stack_fffffffffffff0c0[8];
  opts_02.also_positional = (bool)in_stack_fffffffffffff0c0[9];
  opts_02._66_6_ = in_stack_fffffffffffff0c0._10_6_;
  ::RPCArg::RPCArg(&local_288,name_02,(Type)local_928,fallback_02,description_07,opts_02);
  local_a68[0] = local_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"finalize","");
  bVar16 = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_b20,(bool *)&stack0xfffffffffffff0bd);
  paVar1 = &local_b20.val.field_2;
  local_ac8._8_8_ = (long)&local_ac8 + 0x18;
  local_ac8._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_b20.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20.val._M_dataplus._M_p == paVar1) {
    local_ac8._32_8_ = local_b20.val.field_2._8_8_;
  }
  else {
    local_ac8._8_8_ = local_b20.val._M_dataplus._M_p;
  }
  local_ac8._16_8_ = local_b20.val._M_string_length;
  local_b20.val._M_string_length = 0;
  local_b20.val.field_2._M_local_buf[0] = '\0';
  local_ac8._40_8_ =
       local_b20.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_ac8._48_8_ =
       local_b20.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_ac8._56_8_ =
       local_b20.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b20.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b20.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b20.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac8._64_4_ =
       local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_ac8._68_4_ =
       local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_ac8._72_4_ =
       local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_ac8._76_4_ =
       local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_ac8._80_8_ =
       local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a70 = 2;
  local_b40[0] = local_b30;
  local_b20.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b40,"Also finalize inputs if possible","");
  local_b80 = &local_b70;
  local_b88 = 0;
  local_b78 = 0;
  local_b70 = 0;
  local_b60._0_8_ = (pointer)0x0;
  local_b60._8_2_ = 0;
  local_b60._10_6_ = 0;
  local_b60._16_2_ = 0;
  local_b60._18_8_ = 0;
  name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  name_03._M_string_length = (size_type)in_RDI;
  name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  name_03.field_2._8_8_ = in_stack_fffffffffffff000;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff010;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff008;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff018;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff028;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff030;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff038;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff040;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff048;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff050;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff058;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff060;
  description_08._M_string_length = (size_type)in_stack_fffffffffffff070;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff078;
  description_08.field_2._8_8_ = in_stack_fffffffffffff080;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = bVar16;
  opts_03._0_53_ = in_stack_fffffffffffff088;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = bVar17;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = bVar18;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0c0._0_8_;
  opts_03.hidden = (bool)in_stack_fffffffffffff0c0[8];
  opts_03.also_positional = (bool)in_stack_fffffffffffff0c0[9];
  opts_03._66_6_ = in_stack_fffffffffffff0c0._10_6_;
  ::RPCArg::RPCArg(&local_180,name_03,(Type)local_a68,fallback_03,description_08,opts_03);
  __l._M_len = 5;
  __l._M_array = &local_5a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff0c0,__l,
             (allocator_type *)&stack0xfffffffffffff0bc);
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"");
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c50,"");
  local_e08[0] = (pointer)local_df8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"psbt","");
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,"The base64-encoded partially signed transaction","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff000;
  description._M_string_length = in_stack_fffffffffffff010;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff008;
  description.field_2 = in_stack_fffffffffffff018;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff030;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff028;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff038;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_df8 + 0x10),STR,m_key_name,description,inner,SUB81(local_e08,0));
  local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e48,"complete","");
  local_e68[0] = local_e58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e68,"If the transaction has a complete set of signatures","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffefe8;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff000;
  description_00._M_string_length = in_stack_fffffffffffff010;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff008;
  description_00.field_2 = in_stack_fffffffffffff018;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff030;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff028;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff038;
  ::RPCResult::RPCResult(&local_d60,BOOL,m_key_name_00,description_00,inner_00,SUB81(&local_e48,0));
  local_e88[0] = local_e78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,"hex","");
  local_ea8[0] = local_e98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ea8,"The hex-encoded network transaction if complete","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  uVar6 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_ffffffffffffefec;
  auVar3._12_8_ = in_stack_ffffffffffffeff8;
  auVar3._20_8_ = in_stack_fffffffffffff000;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff010;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff008;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff018._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult
            (&local_cd8,STR_HEX,(string)(auVar3 << 0x20),SUB81(local_e88,0),description_01,inner_01,
             true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)(local_df8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff088,__l_00,
             (allocator_type *)&stack0xfffffffffffff027);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffefec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeff8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff000;
  description_02._M_string_length = in_stack_fffffffffffff010;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff008;
  description_02.field_2 = in_stack_fffffffffffff018;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  ::RPCResult::RPCResult(&local_c10,OBJ,m_key_name_01,description_02,inner_02,SUB81(local_c30,0));
  result._4_4_ = in_stack_ffffffffffffefec;
  result.m_type = uVar6;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffeff8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff000;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff008;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff010;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff018;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff040;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff060;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff0a0,result);
  local_f08._M_dataplus._M_p = (pointer)&local_f08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f08,"walletprocesspsbt","");
  local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f28,"\"psbt\"","");
  HelpExampleCli(&local_ee8,&local_f08,&local_f28);
  paVar1 = &local_ee8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee8._M_dataplus._M_p == paVar1) {
    local_eb8._8_8_ = local_ee8.field_2._8_8_;
    local_ec8 = &local_eb8;
  }
  else {
    local_ec8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ee8._M_dataplus._M_p;
  }
  local_eb8._M_allocated_capacity._1_7_ = local_ee8.field_2._M_allocated_capacity._1_7_;
  local_eb8._M_local_buf[0] = local_ee8.field_2._M_local_buf[0];
  local_ec0 = local_ee8._M_string_length;
  local_ee8._M_string_length = 0;
  local_ee8.field_2._M_local_buf[0] = '\0';
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/spend.cpp:1606:9)>
           ::_M_manager;
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/spend.cpp:1606:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/spend.cpp:1606:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffff018;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff040;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = in_stack_fffffffffffff060;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_ee8._M_dataplus._M_p = (pointer)paVar1;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffeff8)),description_03,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xffffffffffffeff8,&stack0xffffffffffffeff8,3);
  }
  if (local_ec8 != &local_eb8) {
    operator_delete(local_ec8,local_eb8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee8._M_dataplus._M_p != paVar1) {
    operator_delete(local_ee8._M_dataplus._M_p,
                    CONCAT71(local_ee8.field_2._M_allocated_capacity._1_7_,
                             local_ee8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
    operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
    operator_delete(local_f08._M_dataplus._M_p,local_f08.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10.m_cond._M_dataplus._M_p != &local_c10.m_cond.field_2) {
    operator_delete(local_c10.m_cond._M_dataplus._M_p,
                    local_c10.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10.m_description._M_dataplus._M_p != &local_c10.m_description.field_2) {
    operator_delete(local_c10.m_description._M_dataplus._M_p,
                    local_c10.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c10.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10.m_key_name._M_dataplus._M_p != &local_c10.m_key_name.field_2) {
    operator_delete(local_c10.m_key_name._M_dataplus._M_p,
                    local_c10.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff088);
  lVar5 = 0x198;
  do {
    if ((long *)(local_df8 + lVar5) != *(long **)((long)local_e08 + lVar5)) {
      operator_delete(*(long **)((long)local_e08 + lVar5),*(long *)(local_df8 + lVar5) + 1);
    }
    if ((long *)((long)local_e18 + lVar5) != *(long **)((long)local_e28 + lVar5)) {
      operator_delete(*(long **)((long)local_e28 + lVar5),*(long *)((long)local_e18 + lVar5) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar5));
    if ((long *)((long)local_e58 + lVar5) != *(long **)((long)local_e68 + lVar5)) {
      operator_delete(*(long **)((long)local_e68 + lVar5),*(long *)((long)local_e58 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff028);
  if (local_ea8[0] != local_e98) {
    operator_delete(local_ea8[0],local_e98[0] + 1);
  }
  if (local_e88[0] != local_e78) {
    operator_delete(local_e88[0],local_e78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff048);
  if (local_e68[0] != local_e58) {
    operator_delete(local_e68[0],local_e58[0] + 1);
  }
  if (local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_e48.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff068);
  if (local_e28[0] != local_e18) {
    operator_delete(local_e28[0],local_e18[0] + 1);
  }
  if (local_e08[0] != (pointer)local_df8) {
    operator_delete(local_e08[0],local_df8._0_8_ + 1);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0],local_c40[0] + 1);
  }
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0],local_c20[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff0c0);
  lVar5 = 0x528;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_5c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar5));
    plVar2 = *(long **)((long)&local_620 + lVar5 + 0x40);
    plVar4 = (long *)((long)&local_620 + lVar5 + 0x50);
    if (plVar4 != plVar2) {
      operator_delete(plVar2,*plVar4 + 1);
    }
    plVar4 = (long *)((long)&local_620 + lVar5 + 0x28);
    plVar2 = *(long **)((long)&local_620 + lVar5 + 0x18);
    if (plVar4 != plVar2) {
      operator_delete(plVar2,*plVar4 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_668 + lVar5));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar5
               ));
    if ((long *)((long)local_698 + lVar5) != *(long **)((long)local_6a8 + lVar5)) {
      operator_delete(*(long **)((long)local_6a8 + lVar5),*(long *)((long)local_698 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x108;
  } while (lVar5 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b60);
  if (local_b80 != &local_b70) {
    operator_delete(local_b80,CONCAT71(uStack_b6f,local_b70) + 1);
  }
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0],local_b30[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ac8._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b20.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b20.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20.val._M_dataplus._M_p != &local_b20.val.field_2) {
    operator_delete(local_b20.val._M_dataplus._M_p,
                    CONCAT71(local_b20.val.field_2._M_allocated_capacity._1_7_,
                             local_b20.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_a68[0] != local_a58) {
    operator_delete(local_a68[0],local_a58[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a20);
  if (local_a40 != &local_a30) {
    operator_delete(local_a40,CONCAT71(uStack_a2f,local_a30) + 1);
  }
  if (local_a00[0] != local_9f0) {
    operator_delete(local_a00[0],local_9f0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_988._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_9e0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9e0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0.val._M_dataplus._M_p != &local_9e0.val.field_2) {
    operator_delete(local_9e0.val._M_dataplus._M_p,
                    CONCAT71(local_9e0.val.field_2._M_allocated_capacity._1_7_,
                             local_9e0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_928[0] != local_918) {
    operator_delete(local_928[0],local_918[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8e0);
  if (local_900 != &local_8f0) {
    operator_delete(local_900,CONCAT71(uStack_8ef,local_8f0) + 1);
  }
  if (local_8c0[0] != local_8b0) {
    operator_delete(local_8c0[0],local_8b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_848._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_8a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.val._M_dataplus._M_p != &local_8a0.val.field_2) {
    operator_delete(local_8a0.val._M_dataplus._M_p,
                    CONCAT71(local_8a0.val.field_2._M_allocated_capacity._1_7_,
                             local_8a0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7a0);
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0,CONCAT71(uStack_7af,local_7b0) + 1);
  }
  if (local_780[0] != local_770) {
    operator_delete(local_780[0],local_770[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_708._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_760.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_760.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.val._M_dataplus._M_p != &local_760.val.field_2) {
    operator_delete(local_760.val._M_dataplus._M_p,
                    CONCAT71(local_760.val.field_2._M_allocated_capacity._1_7_,
                             local_760.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_660);
  if (local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_680.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_620._M_first);
  if (local_5c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_5c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_5c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_5c0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletprocesspsbt()
{
    return RPCHelpMan{"walletprocesspsbt",
                "\nUpdate a PSBT with input information from our wallet and then sign inputs\n"
                "that we can sign for." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction base64 string"},
                    {"sign", RPCArg::Type::BOOL, RPCArg::Default{true}, "Also sign the transaction when updating (requires wallet to be unlocked)"},
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type to sign with if not specified by the PSBT. Must be one of\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\""},
                    {"bip32derivs", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include BIP 32 derivation paths for public keys if we know them"},
                    {"finalize", RPCArg::Type::BOOL, RPCArg::Default{true}, "Also finalize inputs if possible"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", "The base64-encoded partially signed transaction"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The hex-encoded network transaction if complete"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("walletprocesspsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const CWallet& wallet{*pwallet};
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    // Unserialize the transaction
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    // Get the sighash type
    int nHashType = ParseSighashString(request.params[2]);

    // Fill transaction with our data and also sign
    bool sign = request.params[1].isNull() ? true : request.params[1].get_bool();
    bool bip32derivs = request.params[3].isNull() ? true : request.params[3].get_bool();
    bool finalize = request.params[4].isNull() ? true : request.params[4].get_bool();
    bool complete = true;

    if (sign) EnsureWalletIsUnlocked(*pwallet);

    const auto err{wallet.FillPSBT(psbtx, complete, nHashType, sign, bip32derivs, nullptr, finalize)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    UniValue result(UniValue::VOBJ);
    DataStream ssTx{};
    ssTx << psbtx;
    result.pushKV("psbt", EncodeBase64(ssTx.str()));
    result.pushKV("complete", complete);
    if (complete) {
        CMutableTransaction mtx;
        // Returns true if complete, which we already think it is.
        CHECK_NONFATAL(FinalizeAndExtractPSBT(psbtx, mtx));
        DataStream ssTx_final;
        ssTx_final << TX_WITH_WITNESS(mtx);
        result.pushKV("hex", HexStr(ssTx_final));
    }

    return result;
},
    };
}